

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void UpdateLockDefnsList(SstStream Stream,WS_ReaderInfo CP_WSR_Stream,long EffectiveTimestep)

{
  void *pvVar1;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  if ((*(int *)(in_RDI + 0x158) != 0) && (*(int *)(in_RSI + 0x28) != 0)) {
    pvVar1 = realloc(*(void **)(in_RDI + 0x208),(long)(*(int *)(in_RDI + 0x200) + 1) << 4);
    *(void **)(in_RDI + 0x208) = pvVar1;
    *(undefined8 *)(*(long *)(in_RDI + 0x208) + (long)*(int *)(in_RDI + 0x200) * 0x10) = in_RDX;
    *(long *)(*(long *)(in_RDI + 0x208) + (long)*(int *)(in_RDI + 0x200) * 0x10 + 8) = in_RSI;
    *(int *)(in_RDI + 0x200) = *(int *)(in_RDI + 0x200) + 1;
  }
  return;
}

Assistant:

static void UpdateLockDefnsList(SstStream Stream, WS_ReaderInfo CP_WSR_Stream,
                                long EffectiveTimestep)
{
    if (Stream->WriterDefinitionsLocked && CP_WSR_Stream->LocalReaderDefinitionsLocked)
    {
        Stream->LockDefnsList = realloc(Stream->LockDefnsList, sizeof(Stream->LockDefnsList[0]) *
                                                                   (Stream->LockDefnsCount + 1));
        Stream->LockDefnsList[Stream->LockDefnsCount].Timestep = EffectiveTimestep;
        // this only happens on rank 0, so CP_WSR_Stream is our global reader
        // stream identifier
        Stream->LockDefnsList[Stream->LockDefnsCount].Reader = CP_WSR_Stream;
        Stream->LockDefnsCount++;
    }
}